

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wallet.cpp
# Opt level: O1

isminetype __thiscall wallet::CWallet::IsMine(CWallet *this,COutPoint *outpoint)

{
  long lVar1;
  long lVar2;
  isminetype iVar3;
  const_iterator cVar4;
  ulong uVar5;
  ulong uVar6;
  long in_FS_OFFSET;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  cVar4 = std::
          _Hashtable<uint256,_std::pair<const_uint256,_wallet::CWalletTx>,_std::allocator<std::pair<const_uint256,_wallet::CWalletTx>_>,_std::__detail::_Select1st,_std::equal_to<uint256>,_SaltedTxidHasher,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
          ::find(&(this->mapWallet)._M_h,(key_type *)outpoint);
  if (cVar4.super__Node_iterator_base<std::pair<const_uint256,_wallet::CWalletTx>,_true>._M_cur !=
      (__node_type *)0x0) {
    uVar5 = (ulong)outpoint->n;
    lVar2 = *(long *)(*(long *)((long)cVar4.
                                      super__Node_iterator_base<std::pair<const_uint256,_wallet::CWalletTx>,_true>
                                      ._M_cur + 0x1c0) + 0x18);
    uVar6 = (*(long *)(*(long *)((long)cVar4.
                                       super__Node_iterator_base<std::pair<const_uint256,_wallet::CWalletTx>,_true>
                                       ._M_cur + 0x1c0) + 0x20) - lVar2 >> 3) * -0x3333333333333333;
    if (uVar5 <= uVar6 && uVar6 - uVar5 != 0) {
      if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
        iVar3 = IsMine(this,(CScript *)(lVar2 + uVar5 * 0x28 + 8));
        return iVar3;
      }
      goto LAB_00c4bcc2;
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return ISMINE_NO;
  }
LAB_00c4bcc2:
  __stack_chk_fail();
}

Assistant:

isminetype CWallet::IsMine(const COutPoint& outpoint) const
{
    AssertLockHeld(cs_wallet);
    auto wtx = GetWalletTx(outpoint.hash);
    if (!wtx) {
        return ISMINE_NO;
    }
    if (outpoint.n >= wtx->tx->vout.size()) {
        return ISMINE_NO;
    }
    return IsMine(wtx->tx->vout[outpoint.n]);
}